

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O1

bool Am_Value_List::List_Or_Value_Equal(Am_Value *v1,Am_Value *v2)

{
  bool bVar1;
  bool bVar2;
  Am_Value_List l;
  Am_Value_List local_30;
  
  bVar1 = Am_Value::operator==(v1,v2);
  if (bVar1) {
    return true;
  }
  Am_Value_List(&local_30);
  if (((((v1->value).wrapper_value != (Am_Wrapper *)0x0) && (v1->type == Am_Value_List_Data::id)) &&
      (operator=(&local_30,v1), local_30.data != (Am_Value_List_Data *)0x0)) &&
     (*(short *)&((local_30.data)->super_Am_Wrapper).field_0xc == 1)) {
    bVar1 = Am_Value::operator==(&(local_30.data)->head->super_Am_Value,v2);
    bVar2 = true;
    if (bVar1) goto LAB_0022e79a;
  }
  if ((((v2->value).wrapper_value != (Am_Wrapper *)0x0) && (v2->type == Am_Value_List_Data::id)) &&
     ((operator=(&local_30,v2), local_30.data != (Am_Value_List_Data *)0x0 &&
      (*(short *)&((local_30.data)->super_Am_Wrapper).field_0xc == 1)))) {
    bVar1 = Am_Value::operator==(&(local_30.data)->head->super_Am_Value,v1);
    bVar2 = true;
    if (bVar1) goto LAB_0022e79a;
  }
  bVar2 = false;
LAB_0022e79a:
  ~Am_Value_List(&local_30);
  return bVar2;
}

Assistant:

bool
Am_Value_List::List_Or_Value_Equal(const Am_Value &v1, const Am_Value &v2)
{
  if (v1 == v2)
    return true;
  Am_Value_List l;
  if (Am_Value_List::Test(v1)) {
    l = v1;
    if (l.data && l.data->number == 1 && *(l.data->head) == v2)
      return true;
  }
  if (Am_Value_List::Test(v2)) {
    l = v2;
    if (l.data && l.data->number == 1 && *(l.data->head) == v1)
      return true;
  }
  return false;
}